

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O3

CommPtr __thiscall Omega_h::Library::self(Library *this)

{
  Alloc *pAVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  CommPtr CVar2;
  CommPtr CVar3;
  
  in_RDI->library_ =
       (Library *)(this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pAVar1 = (Alloc *)(this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  (in_RDI->srcs_).write_.shared_alloc_.alloc = pAVar1;
  if (pAVar1 != (Alloc *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&(pAVar1->name)._M_dataplus._M_p = *(int *)&(pAVar1->name)._M_dataplus._M_p + 1;
      CVar2.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      CVar2.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (CommPtr)CVar2.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)&(pAVar1->name)._M_dataplus._M_p = *(int *)&(pAVar1->name)._M_dataplus._M_p + 1;
    UNLOCK();
  }
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (CommPtr)CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Library::self() {
#ifdef OMEGA_H_USE_MPI
  if (!self_) {
    MPI_Comm self_dup;
    MPI_Comm_dup(MPI_COMM_SELF, &self_dup);
    self_ = CommPtr(new Comm(this, self_dup));
  }
#endif
  return self_;
}